

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O1

void anon_unknown.dwarf_9b16::update_manifest(Manifest *manifest,Target *target,xml_node node)

{
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *this;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *this_00;
  Manifest *this_01;
  bool bVar1;
  int iVar2;
  xml_node *pxVar3;
  char_t *pcVar4;
  size_t sVar5;
  pair<std::_Rb_tree_iterator<wire::string>,_std::_Rb_tree_iterator<wire::string>_> pVar6;
  xml_node child;
  xml_named_node_iterator __end1_1;
  xml_named_node_iterator __begin1_1;
  xml_node rn;
  xml_named_node_iterator __begin1;
  xml_named_node_iterator __end1;
  xml_node local_120;
  xml_attribute local_118;
  xml_node local_110;
  xml_named_node_iterator local_108;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  Manifest *local_d8;
  xml_object_range<pugi::xml_named_node_iterator> local_d0;
  xml_named_node_iterator local_b0;
  Target *local_a0;
  xml_node local_98;
  xml_named_node_iterator local_90;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *local_80;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *local_78;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *local_70;
  xml_named_node_iterator local_68;
  xml_node local_58;
  xml_object_range<pugi::xml_named_node_iterator> local_50;
  
  local_d8 = manifest;
  local_a0 = target;
  local_58._root = node._root;
  pugi::xml_node::children(&local_50,&local_58,"require");
  local_90._node._root = local_50._begin._node._root;
  local_90._name = local_50._begin._name;
  local_68._node._root = local_50._end._node._root;
  local_68._name = local_50._end._name;
  bVar1 = pugi::xml_named_node_iterator::operator!=(&local_90,&local_68);
  if (bVar1) {
    local_70 = &local_d8->types;
    local_78 = &local_d8->enums;
    local_80 = &local_d8->commands;
    do {
      pxVar3 = pugi::xml_named_node_iterator::operator*(&local_90);
      local_110._root = pxVar3->_root;
      pugi::xml_node::children(&local_d0,&local_110,"type");
      local_b0._node._root = local_d0._begin._node._root;
      local_b0._name = local_d0._begin._name;
      local_108._node._root = local_d0._end._node._root;
      local_108._name = local_d0._end._name;
      while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b0,&local_108), bVar1) {
        pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b0);
        local_120._root = pxVar3->_root;
        local_118 = pugi::xml_node::attribute(&local_120,"name");
        pcVar4 = pugi::xml_attribute::value(&local_118);
        if (pcVar4 == (char_t *)0x0) {
          pcVar4 = "";
        }
        local_f8[0] = local_e8;
        sVar5 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,pcVar4,pcVar4 + sVar5);
        std::
        _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
        ::_M_insert_unique<wire::string>(&local_70->_M_t,(string *)local_f8);
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0]);
        }
        pugi::xml_named_node_iterator::operator++(&local_b0);
      }
      pugi::xml_node::children(&local_d0,&local_110,"enum");
      local_b0._node._root = local_d0._begin._node._root;
      local_b0._name = local_d0._begin._name;
      local_108._node._root = local_d0._end._node._root;
      local_108._name = local_d0._end._name;
      while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b0,&local_108), bVar1) {
        pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b0);
        local_120._root = pxVar3->_root;
        local_118 = pugi::xml_node::attribute(&local_120,"name");
        pcVar4 = pugi::xml_attribute::value(&local_118);
        if (pcVar4 == (char_t *)0x0) {
          pcVar4 = "";
        }
        local_f8[0] = local_e8;
        sVar5 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,pcVar4,pcVar4 + sVar5);
        std::
        _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
        ::_M_insert_unique<wire::string>(&local_78->_M_t,(string *)local_f8);
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0]);
        }
        pugi::xml_named_node_iterator::operator++(&local_b0);
      }
      pugi::xml_node::children(&local_d0,&local_110,"command");
      local_b0._node._root = local_d0._begin._node._root;
      local_b0._name = local_d0._begin._name;
      local_108._node._root = local_d0._end._node._root;
      local_108._name = local_d0._end._name;
      while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b0,&local_108), bVar1) {
        pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b0);
        local_120._root = pxVar3->_root;
        local_118 = pugi::xml_node::attribute(&local_120,"name");
        pcVar4 = pugi::xml_attribute::value(&local_118);
        if (pcVar4 == (char_t *)0x0) {
          pcVar4 = "";
        }
        local_f8[0] = local_e8;
        sVar5 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,pcVar4,pcVar4 + sVar5);
        std::
        _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
        ::_M_insert_unique<wire::string>(&local_80->_M_t,(string *)local_f8);
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0]);
        }
        pugi::xml_named_node_iterator::operator++(&local_b0);
      }
      pugi::xml_named_node_iterator::operator++(&local_90);
      bVar1 = pugi::xml_named_node_iterator::operator!=(&local_90,&local_68);
    } while (bVar1);
  }
  pugi::xml_node::children(&local_50,&local_58,"remove");
  local_90._node._root = local_50._begin._node._root;
  local_90._name = local_50._begin._name;
  local_68._node._root = local_50._end._node._root;
  local_68._name = local_50._end._name;
  bVar1 = pugi::xml_named_node_iterator::operator!=(&local_90,&local_68);
  if (bVar1) {
    local_a0 = (Target *)&local_a0->profile;
    this = &local_d8->types;
    this_00 = &local_d8->enums;
    local_d8 = (Manifest *)&local_d8->commands;
    do {
      pxVar3 = pugi::xml_named_node_iterator::operator*(&local_90);
      local_98._root = pxVar3->_root;
      local_d0._begin._node._root =
           (xml_node_struct *)pugi::xml_node::attribute(&local_98,"profile");
      pugi::xml_attribute::value((xml_attribute *)&local_d0);
      iVar2 = std::__cxx11::string::compare((char *)local_a0);
      if (iVar2 == 0) {
        local_110._root = local_98._root;
        pugi::xml_node::children(&local_d0,&local_110,"type");
        local_b0._node._root = local_d0._begin._node._root;
        local_b0._name = local_d0._begin._name;
        local_108._node._root = local_d0._end._node._root;
        local_108._name = local_d0._end._name;
        while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b0,&local_108), bVar1) {
          pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b0);
          local_120._root = pxVar3->_root;
          local_118 = pugi::xml_node::attribute(&local_120,"name");
          pcVar4 = pugi::xml_attribute::value(&local_118);
          if (pcVar4 == (char_t *)0x0) {
            pcVar4 = "";
          }
          local_f8[0] = local_e8;
          sVar5 = strlen(pcVar4);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,pcVar4,pcVar4 + sVar5);
          pVar6 = std::
                  _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                  ::equal_range(&this->_M_t,(key_type *)local_f8);
          std::
          _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
          ::_M_erase_aux(&this->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node)
          ;
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
          pugi::xml_named_node_iterator::operator++(&local_b0);
        }
        pugi::xml_node::children(&local_d0,&local_110,"enum");
        local_b0._node._root = local_d0._begin._node._root;
        local_b0._name = local_d0._begin._name;
        local_108._node._root = local_d0._end._node._root;
        local_108._name = local_d0._end._name;
        while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b0,&local_108), bVar1) {
          pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b0);
          local_120._root = pxVar3->_root;
          local_118 = pugi::xml_node::attribute(&local_120,"name");
          pcVar4 = pugi::xml_attribute::value(&local_118);
          if (pcVar4 == (char_t *)0x0) {
            pcVar4 = "";
          }
          local_f8[0] = local_e8;
          sVar5 = strlen(pcVar4);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,pcVar4,pcVar4 + sVar5);
          pVar6 = std::
                  _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                  ::equal_range(&this_00->_M_t,(key_type *)local_f8);
          std::
          _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
          ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,
                         (_Base_ptr)pVar6.second._M_node);
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
          pugi::xml_named_node_iterator::operator++(&local_b0);
        }
        pugi::xml_node::children(&local_d0,&local_110,"command");
        local_b0._node._root = local_d0._begin._node._root;
        local_b0._name = local_d0._begin._name;
        local_108._node._root = local_d0._end._node._root;
        local_108._name = local_d0._end._name;
        while (bVar1 = pugi::xml_named_node_iterator::operator!=(&local_b0,&local_108), bVar1) {
          pxVar3 = pugi::xml_named_node_iterator::operator*(&local_b0);
          local_120._root = pxVar3->_root;
          local_118 = pugi::xml_node::attribute(&local_120,"name");
          pcVar4 = pugi::xml_attribute::value(&local_118);
          if (pcVar4 == (char_t *)0x0) {
            pcVar4 = "";
          }
          local_f8[0] = local_e8;
          sVar5 = strlen(pcVar4);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,pcVar4,pcVar4 + sVar5);
          this_01 = local_d8;
          pVar6 = std::
                  _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                  ::equal_range((_Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                                 *)local_d8,(key_type *)local_f8);
          std::
          _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
          ::_M_erase_aux((_Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
                          *)this_01,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
          pugi::xml_named_node_iterator::operator++(&local_b0);
        }
      }
      pugi::xml_named_node_iterator::operator++(&local_90);
      bVar1 = pugi::xml_named_node_iterator::operator!=(&local_90,&local_68);
    } while (bVar1);
  }
  return;
}

Assistant:

void update_manifest(Manifest& manifest,
                     const Target& target,
                     const pugi::xml_node node)
{
  for (const pugi::xml_node rn : node.children("require"))
    add_to_manifest(manifest, rn);

  // Apply <remove> tags for the selected profile
  for (const pugi::xml_node rn : node.children("remove"))
  {
    if (rn.attribute("profile").value() == target.profile)
      remove_from_manifest(manifest, rn);
  }
}